

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

us_socket_t *
us_socket_context_connect
          (int ssl,us_socket_context_t *context,char *host,int port,char *source_host,int options,
          int socket_ext_size)

{
  us_socket_t *puVar1;
  int iVar2;
  int __fd;
  uint uVar3;
  us_internal_ssl_socket_t *puVar4;
  us_socket_t *p;
  addrinfo *result;
  char port_string [16];
  addrinfo *local_88;
  addrinfo *local_80;
  char local_78 [16];
  addrinfo local_68;
  
  if (ssl != 0) {
    puVar4 = us_internal_ssl_socket_context_connect
                       ((us_internal_ssl_socket_context_t *)context,host,port,source_host,options,
                        socket_ext_size);
    return &puVar4->s;
  }
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  snprintf(local_78,0x10,"%d");
  iVar2 = getaddrinfo(host,local_78,&local_68,&local_88);
  __fd = -1;
  if (iVar2 == 0) {
    __fd = socket(local_88->ai_family,local_88->ai_socktype | 0x80800,local_88->ai_protocol);
    uVar3 = fcntl(__fd,3,0);
    fcntl(__fd,4,(ulong)(uVar3 | 0x800));
    if (__fd == -1) {
      __fd = -1;
    }
    else {
      if (source_host != (char *)0x0) {
        getaddrinfo(source_host,(char *)0x0,(addrinfo *)0x0,&local_80);
        bind(__fd,local_80->ai_addr,local_80->ai_addrlen);
        freeaddrinfo(local_80);
      }
      connect(__fd,local_88->ai_addr,local_88->ai_addrlen);
    }
    freeaddrinfo(local_88);
  }
  if (__fd == -1) {
    p = (us_socket_t *)0x0;
  }
  else {
    p = (us_socket_t *)us_create_poll(context->loop,0,socket_ext_size + 0x30);
    us_poll_init((us_poll_t *)p,__fd,2);
    us_poll_start((us_poll_t *)p,context->loop,4);
    p->context = context;
    p->timeout = 0;
    puVar1 = context->head;
    p->next = puVar1;
    p->prev = (us_socket_t *)0x0;
    if (puVar1 != (us_socket_t *)0x0) {
      puVar1->prev = p;
    }
    context->head = p;
  }
  return p;
}

Assistant:

struct us_socket_t *us_socket_context_connect(int ssl, struct us_socket_context_t *context, const char *host, int port, const char *source_host, int options, int socket_ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_t *) us_internal_ssl_socket_context_connect((struct us_internal_ssl_socket_context_t *) context, host, port, source_host, options, socket_ext_size);
    }
#endif

    LIBUS_SOCKET_DESCRIPTOR connect_socket_fd = bsd_create_connect_socket(host, port, source_host, options);
    if (connect_socket_fd == LIBUS_SOCKET_ERROR) {
        return 0;
    }

    /* Connect sockets are semi-sockets just like listen sockets */
    struct us_poll_t *p = us_create_poll(context->loop, 0, sizeof(struct us_socket_t) + socket_ext_size);
    us_poll_init(p, connect_socket_fd, POLL_TYPE_SEMI_SOCKET);
    us_poll_start(p, context->loop, LIBUS_SOCKET_WRITABLE);

    struct us_socket_t *connect_socket = (struct us_socket_t *) p;

    /* Link it into context so that timeout fires properly */
    connect_socket->context = context;
    us_internal_socket_context_link(context, connect_socket);

    return connect_socket;
}